

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O3

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalDummyScan::Deserialize(LogicalDummyScan *this,Deserializer *deserializer)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  _func_int **pp_Var4;
  LogicalOperator *this_00;
  _func_int **pp_Var3;
  
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"table_index");
  pp_Var4 = deserializer->_vptr_Deserializer;
  if ((char)uVar1 == '\0') {
    pp_Var3 = (_func_int **)0x0;
  }
  else {
    iVar2 = (*pp_Var4[0x15])(deserializer);
    pp_Var3 = (_func_int **)CONCAT44(extraout_var,iVar2);
    pp_Var4 = deserializer->_vptr_Deserializer;
  }
  (*pp_Var4[5])(deserializer,(ulong)(uVar1 & 0xff));
  this_00 = (LogicalOperator *)operator_new(0x70);
  LogicalOperator::LogicalOperator(this_00,LOGICAL_DUMMY_SCAN);
  this_00->_vptr_LogicalOperator = (_func_int **)&PTR__LogicalOperator_02446490;
  this_00[1]._vptr_LogicalOperator = pp_Var3;
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)this_00;
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalDummyScan::Deserialize(Deserializer &deserializer) {
	auto table_index = deserializer.ReadPropertyWithDefault<idx_t>(200, "table_index");
	auto result = duckdb::unique_ptr<LogicalDummyScan>(new LogicalDummyScan(table_index));
	return std::move(result);
}